

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O0

void __thiscall
JITTimeWorkItem::InitializeReader
          (JITTimeWorkItem *this,ByteCodeReader *reader,
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          *statementReader,ArenaAllocator *alloc)

{
  Type TVar1;
  code *pcVar2;
  uint uVar3;
  ArenaAllocator *this_00;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_01;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  JITLoopHeaderIDL *pJVar8;
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar9;
  byte *pbVar10;
  JITManager *this_02;
  FunctionBody *this_03;
  StatementMapList *this_04;
  undefined4 *puVar11;
  Type *pTVar12;
  StatementMap *pSVar13;
  Type *ppSVar14;
  SmallSpanSequence *local_b0;
  uint local_6c;
  SmallSpanSequence *spanSeq;
  bool hasSpanSequenceMap;
  uint i_1;
  StatementMapList *runtimeMap;
  uint local_3c;
  StatementMapIDL *pSStack_38;
  uint i;
  StatementMapIDL *fullArr;
  ArenaAllocator *pAStack_28;
  uint startOffset;
  ArenaAllocator *alloc_local;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *statementReader_local;
  ByteCodeReader *reader_local;
  JITTimeWorkItem *this_local;
  
  pAStack_28 = alloc;
  alloc_local = (ArenaAllocator *)statementReader;
  statementReader_local =
       (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
        *)reader;
  reader_local = (ByteCodeReader *)this;
  bVar4 = IsLoopBody(this);
  if (bVar4) {
    pJVar8 = GetLoopHeader(this);
    local_6c = pJVar8->startOffset;
  }
  else {
    local_6c = 0;
  }
  fullArr._4_4_ = local_6c;
  bVar4 = IsJitInDebugMode(this);
  if (bVar4) {
    pLVar9 = JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(pAStack_28,4);
    this->m_fullStatementList = pLVar9;
    pSStack_38 = JITTimeFunctionBody::GetFullStatementMap(&this->m_jitBody);
    for (local_3c = 0; uVar3 = local_3c,
        uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(&this->m_jitBody), uVar3 < uVar6;
        local_3c = local_3c + 1) {
      runtimeMap = (StatementMapList *)(pSStack_38 + local_3c);
      JsUtil::
      List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this->m_fullStatementList,(StatementMap **)&runtimeMap);
    }
  }
  this_01 = statementReader_local;
  pbVar10 = JITTimeFunctionBody::GetByteCodeBuffer(&this->m_jitBody);
  uVar6 = fullArr._4_4_;
  uVar5 = JITTimeFunctionBody::GetByteCodeLength(&this->m_jitBody);
  Js::ByteCodeReader::Create((ByteCodeReader *)this_01,pbVar10,uVar6,uVar5);
  this_02 = JITManager::GetJITManager();
  bVar4 = JITManager::IsOOPJITEnabled(this_02);
  if (!bVar4) {
    this_03 = (FunctionBody *)JITTimeFunctionBody::GetAddr(&this->m_jitBody);
    this_04 = Js::FunctionBody::GetStatementMaps(this_03);
    if (this->m_fullStatementList != (ArenaStatementMapList *)0x0) {
      uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(&this->m_jitBody);
      uVar5 = JsUtil::
              ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
              Count(&this_04->
                     super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   );
      if ((uVar6 != uVar5) ||
         (iVar7 = JsUtil::
                  ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                  ::Count(&this_04->
                           super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                         ), iVar7 < 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,100,
                           "(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0))"
                           ,
                           "!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0)"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    for (spanSeq._4_4_ = 0; uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(&this->m_jitBody),
        spanSeq._4_4_ < uVar6; spanSeq._4_4_ = spanSeq._4_4_ + 1) {
      pTVar12 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_04,spanSeq._4_4_);
      pSVar13 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar12);
      iVar7 = (pSVar13->byteCodeSpan).begin;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,spanSeq._4_4_);
      if (iVar7 != ((*ppSVar14)->byteCodeSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x67,
                           "(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pTVar12 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_04,spanSeq._4_4_);
      pSVar13 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar12);
      iVar7 = (pSVar13->byteCodeSpan).end;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,spanSeq._4_4_);
      if (iVar7 != ((*ppSVar14)->byteCodeSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x68,
                           "(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pTVar12 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_04,spanSeq._4_4_);
      pSVar13 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar12);
      iVar7 = (pSVar13->sourceSpan).begin;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,spanSeq._4_4_);
      if (iVar7 != ((*ppSVar14)->sourceSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x69,
                           "(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pTVar12 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_04,spanSeq._4_4_);
      pSVar13 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar12);
      iVar7 = (pSVar13->sourceSpan).end;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,spanSeq._4_4_);
      if (iVar7 != ((*ppSVar14)->sourceSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6a,
                           "(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pTVar12 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_04,spanSeq._4_4_);
      pSVar13 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(pTVar12);
      TVar1 = pSVar13->isSubexpression;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,spanSeq._4_4_);
      if ((TVar1 & 1U) != ((*ppSVar14)->isSubexpression & 1U)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6b,
                           "(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression)"
                           ,
                           "runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression"
                          );
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
  }
  bVar4 = JITTimeFunctionBody::InitializeStatementMap
                    (&this->m_jitBody,&this->m_statementMap,pAStack_28);
  this_00 = alloc_local;
  if (bVar4) {
    local_b0 = &this->m_statementMap;
  }
  else {
    local_b0 = (SmallSpanSequence *)0x0;
  }
  if (alloc_local != (ArenaAllocator *)0x0) {
    pbVar10 = JITTimeFunctionBody::GetByteCodeBuffer(&this->m_jitBody);
    Js::
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              *)this_00,pbVar10,fullArr._4_4_,local_b0,this->m_fullStatementList);
  }
  return;
}

Assistant:

void
JITTimeWorkItem::InitializeReader(
    Js::ByteCodeReader * reader,
    Js::StatementReader<Js::FunctionBody::ArenaStatementMapList> * statementReader, ArenaAllocator* alloc)
{
    uint startOffset = IsLoopBody() ? GetLoopHeader()->startOffset : 0;

    if (IsJitInDebugMode())
    {
        // TODO: OOP JIT, directly use the array rather than making a list
        m_fullStatementList = Js::FunctionBody::ArenaStatementMapList::New(alloc);
        CompileAssert(sizeof(StatementMapIDL) == sizeof(Js::FunctionBody::StatementMap));

        StatementMapIDL * fullArr = m_jitBody.GetFullStatementMap();
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            m_fullStatementList->Add((Js::FunctionBody::StatementMap*)&fullArr[i]);
        }
    }
#if DBG
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, m_jitBody.GetByteCodeLength());
    if (!JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        Js::FunctionBody::StatementMapList * runtimeMap = ((Js::FunctionBody*)m_jitBody.GetAddr())->GetStatementMaps();
        Assert(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0));
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            Assert(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin);
            Assert(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end);
            Assert(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin);
            Assert(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end);
            Assert(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression);
        }
    }
#else
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset);
#endif
    bool hasSpanSequenceMap = m_jitBody.InitializeStatementMap(&m_statementMap, alloc);
    Js::SmallSpanSequence * spanSeq = hasSpanSequenceMap ? &m_statementMap : nullptr;
    if (statementReader)
    {
        statementReader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, spanSeq, m_fullStatementList);
    }
}